

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

void __thiscall
kratos::InterfaceModPortDefinition::InterfaceModPortDefinition
          (InterfaceModPortDefinition *this,shared_ptr<kratos::InterfaceDefinition> *def,
          string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  undefined8 uVar6;
  
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_002b6528;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar6;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar5;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  p_Var3 = &(this->inputs_)._M_t._M_impl.super__Rb_tree_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->outputs_)._M_t._M_impl.super__Rb_tree_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

InterfaceModPortDefinition::InterfaceModPortDefinition(
    std::shared_ptr<kratos::InterfaceDefinition> def, std::string name)
    : def_(std::move(def)), name_(std::move(name)) {}